

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall State::update(State *this)

{
  map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
  *this_00;
  int *__k;
  _Rb_tree_header *p_Var1;
  pointer pIVar2;
  _Base_ptr in_RAX;
  iterator iVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  ImGuiIO *pIVar6;
  InputEvent *event;
  pointer pIVar7;
  double dVar8;
  iterator client;
  _Rb_tree_iterator<std::pair<const_int,_State::ClientData>_> local_38;
  
  if ((this->clients)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    this_00 = &this->clients;
    __k = &this->curIdControl;
    local_38._M_node = in_RAX;
    iVar3 = std::
            _Rb_tree<int,_std::pair<const_int,_State::ClientData>,_std::_Select1st<std::pair<const_int,_State::ClientData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
            ::find(&this_00->_M_t,__k);
    p_Var1 = &(this->clients)._M_t._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)iVar3._M_node == p_Var1) ||
       (dVar8 = ImGui::GetTime(), (double)this->tControlNext_s < dVar8)) {
      iVar3 = std::
              _Rb_tree<int,_std::pair<const_int,_State::ClientData>,_std::_Select1st<std::pair<const_int,_State::ClientData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
              ::find(&this_00->_M_t,__k);
      if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
        pmVar4 = std::
                 map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
                 ::operator[](this_00,__k);
        pmVar4->hasControl = false;
      }
      uVar5 = (long)this->controlIteration + 1;
      this->controlIteration = (int)uVar5;
      local_38._M_node = (this->clients)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::advance<std::_Rb_tree_iterator<std::pair<int_const,State::ClientData>>,int>
                (&local_38,
                 (int)(uVar5 % (this->clients)._M_t._M_impl.super__Rb_tree_header._M_node_count));
      *(undefined1 *)&local_38._M_node[1]._M_parent = 1;
      this->curIdControl = local_38._M_node[1]._M_color;
      dVar8 = ImGui::GetTime();
      this->tControlNext_s = (float)((double)this->tControl_s + dVar8);
      pIVar6 = ImGui::GetIO();
      ImGuiIO::ClearInputKeys(pIVar6);
    }
    if ((this->clients)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      if (*__k < 1) {
        return;
      }
      pIVar6 = ImGui::GetIO();
      if ((this->lastAddText)._M_string_length != 0) {
        ImGuiIO::AddInputCharactersUTF8(pIVar6,(this->lastAddText)._M_dataplus._M_p);
      }
      pIVar7 = (this->inputEvents).
               super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>._M_impl.
               super__Vector_impl_data._M_start;
      pIVar2 = (this->inputEvents).
               super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (pIVar7 == pIVar2) {
          pIVar7 = (this->inputEvents).
                   super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>._M_impl
                   .super__Vector_impl_data._M_start;
          if ((this->inputEvents).
              super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>._M_impl.
              super__Vector_impl_data._M_finish != pIVar7) {
            (this->inputEvents).
            super__Vector_base<State::InputEvent,_std::allocator<State::InputEvent>_>._M_impl.
            super__Vector_impl_data._M_finish = pIVar7;
          }
          std::__cxx11::string::assign((char *)&this->lastAddText);
          return;
        }
        switch(pIVar7->type) {
        case EKey:
          ImGuiIO::AddKeyEvent(pIVar6,pIVar7->key,pIVar7->isDown);
          break;
        case EMouseButton:
          ImGuiIO::AddMouseButtonEvent(pIVar6,pIVar7->mouseButton,pIVar7->isDown);
        case EMousePos:
          ImGuiIO::AddMousePosEvent(pIVar6,(pIVar7->mousePos).x,(pIVar7->mousePos).y);
          break;
        case EMouseWheel:
          ImGuiIO::AddMouseWheelEvent(pIVar6,pIVar7->mouseWheelX,pIVar7->mouseWheelY);
        }
        pIVar7 = pIVar7 + 1;
      } while( true );
    }
  }
  this->curIdControl = -1;
  return;
}

Assistant:

void State::update() {
    if (clients.size() > 0 && (clients.find(curIdControl) == clients.end() || ImGui::GetTime() > tControlNext_s)) {
        if (clients.find(curIdControl) != clients.end()) {
            clients[curIdControl].hasControl = false;
        }
        int k = ++controlIteration % clients.size();
        auto client = clients.begin();
        std::advance(client, k);
        client->second.hasControl = true;
        curIdControl = client->first;
        tControlNext_s = ImGui::GetTime() + tControl_s;
        ImGui::GetIO().ClearInputKeys();
    }

    if (clients.size() == 0) {
        curIdControl = -1;
    }

    if (curIdControl > 0) {
        {
            auto & io = ImGui::GetIO();

            if (lastAddText.size() > 0) {
                io.AddInputCharactersUTF8(lastAddText.c_str());
            }

            for (const auto & event : inputEvents) {
                switch (event.type) {
                    case InputEvent::Type::EKey:
                        {
                            io.AddKeyEvent(event.key, event.isDown);
                        } break;
                    case InputEvent::Type::EMousePos:
                        {
                            io.AddMousePosEvent(event.mousePos.x, event.mousePos.y);
                        } break;
                    case InputEvent::Type::EMouseButton:
                        {
                            io.AddMouseButtonEvent(event.mouseButton, event.isDown);
                            io.AddMousePosEvent(event.mousePos.x, event.mousePos.y);
                        } break;
                    case InputEvent::Type::EMouseWheel:
                        {
                            io.AddMouseWheelEvent(event.mouseWheelX, event.mouseWheelY);
                        } break;
                };
            }
        }

        inputEvents.clear();
        lastAddText = "";
    }
}